

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.h
# Opt level: O0

void __thiscall
jaegertracing::thrift::AggregationValidatorProcessor::~AggregationValidatorProcessor
          (AggregationValidatorProcessor *this)

{
  AggregationValidatorProcessor *this_local;
  
  ~AggregationValidatorProcessor(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~AggregationValidatorProcessor() {}